

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

int kwsysSystem_Shell__CharNeedsQuotesOnUnix(char c)

{
  undefined1 local_a;
  char c_local;
  
  local_a = true;
  if (((((c != '\'') && (local_a = true, c != '`')) && (local_a = true, c != ';')) &&
      ((((local_a = true, c != '#' && (local_a = true, c != '&')) &&
        ((local_a = true, c != '$' && ((local_a = true, c != '(' && (local_a = true, c != ')'))))))
       && (local_a = true, c != '~')))) &&
     ((((local_a = true, c != '<' && (local_a = true, c != '>')) && (local_a = true, c != '|')) &&
      ((local_a = true, c != '*' && (local_a = true, c != '^')))))) {
    local_a = c == '\\';
  }
  return (int)local_a;
}

Assistant:

static int kwsysSystem_Shell__CharNeedsQuotesOnUnix(char c)
{
  return ((c == '\'') || (c == '`') || (c == ';') || (c == '#') ||
          (c == '&') || (c == '$') || (c == '(') || (c == ')') ||
          (c == '~') || (c == '<') || (c == '>') || (c == '|') ||
          (c == '*') || (c == '^') || (c == '\\'));
}